

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

void __thiscall
inipp::Ini<char>::generate(Ini<char> *this,basic_ostream<char,_std::char_traits<char>_> *os)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  Sections *__range2;
  
  for (p_Var3 = (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->sections)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar1 = std::operator<<((ostream *)os,
                             ((this->format).
                              super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->char_section_start);
    poVar1 = std::operator<<(poVar1,(string *)(p_Var3 + 1));
    poVar1 = std::operator<<(poVar1,((this->format).
                                     super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->char_section_end);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (p_Var2 = p_Var3[2]._M_right; p_Var2 != (_Rb_tree_node_base *)&p_Var3[2]._M_parent;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      poVar1 = std::operator<<((ostream *)os,(string *)(p_Var2 + 1));
      poVar1 = std::operator<<(poVar1,((this->format).
                                       super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->char_assign);
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)os);
  }
  return;
}

Assistant:

void generate(std::basic_ostream<CharT>& os) const {
		for (auto const & sec : sections) {
			os << format->char_section_start << sec.first << format->char_section_end << std::endl;
			for (auto const & val : sec.second) {
				os << val.first << format->char_assign << val.second << std::endl;
			}
			os << std::endl;
		}
	}